

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void tcu::fillWithRepeatableGradient(PixelBufferAccess *access,Vec4 *colorA,Vec4 *colorB)

{
  int iVar1;
  uint uVar2;
  int y;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  Vec4 local_58;
  undefined1 local_48 [16];
  undefined1 auVar11 [16];
  
  iVar3 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
  if (0 < iVar3) {
    iVar1 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
    y = 0;
    do {
      if (0 < iVar1) {
        local_48 = ZEXT416((uint)((float)y + 0.5));
        iVar3 = 0;
        do {
          auVar10._0_4_ = (float)(access->super_ConstPixelBufferAccess).m_size.m_data[1];
          auVar10._4_4_ = (float)iVar1;
          auVar10._8_4_ = (float)(access->super_ConstPixelBufferAccess).m_pitch.m_data[0];
          auVar10._12_4_ = (float)(access->super_ConstPixelBufferAccess).m_pitch.m_data[1];
          auVar8._4_4_ = (float)iVar3 + 0.5;
          auVar8._0_4_ = local_48._0_4_;
          auVar8._8_4_ = local_48._8_4_;
          auVar8._12_4_ = local_48._12_4_;
          auVar8 = divps(auVar8,auVar10);
          fVar6 = auVar8._0_4_;
          fVar7 = auVar8._4_4_;
          fVar9 = fVar7 + fVar7;
          iVar4 = -(uint)(0.5 < fVar6);
          iVar5 = -(uint)(0.5 < fVar7);
          auVar12._4_4_ = iVar5;
          auVar12._0_4_ = iVar4;
          auVar12._8_4_ = iVar5;
          auVar12._12_4_ = iVar5;
          auVar11._8_8_ = auVar12._8_8_;
          auVar11._4_4_ = iVar4;
          auVar11._0_4_ = iVar4;
          uVar2 = movmskpd(iVar1,auVar11);
          if ((uVar2 & 2) != 0) {
            fVar9 = 2.0 - fVar9;
          }
          fVar6 = fVar6 + fVar6;
          if ((uVar2 & 1) != 0) {
            fVar6 = 2.0 - fVar6;
          }
          fVar7 = SQRT(fVar9 * fVar9 + fVar6 * fVar6);
          fVar6 = 1.0;
          if (fVar7 <= 1.0) {
            fVar6 = fVar7;
          }
          fVar6 = (float)(-(uint)(0.0 < fVar7) & (uint)fVar6);
          local_58.m_data[1] = colorA->m_data[1] + fVar6 * (colorB->m_data[1] - colorA->m_data[1]);
          local_58.m_data[0] = colorA->m_data[0] + fVar6 * (colorB->m_data[0] - colorA->m_data[0]);
          local_58.m_data[3] = colorA->m_data[3] + fVar6 * (colorB->m_data[3] - colorA->m_data[3]);
          local_58.m_data[2] = colorA->m_data[2] + fVar6 * (colorB->m_data[2] - colorA->m_data[2]);
          PixelBufferAccess::setPixel(access,&local_58,iVar3,y,0);
          iVar3 = iVar3 + 1;
          iVar1 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
        } while (iVar3 < iVar1);
        iVar3 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
      }
      y = y + 1;
    } while (y < iVar3);
  }
  return;
}

Assistant:

T						y			(void) const { DE_STATIC_ASSERT(Size >= 2); return m_data[1]; }